

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

int do_oprom_code(int argc,char **argv)

{
  char **argv_00;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  img *__ptr;
  void *__ptr_00;
  int argc_1;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  _Bool has_4ids_extension;
  uint32_t count;
  uint32_t img_type;
  igsc_oprom_image *oimg;
  char local_4a;
  char local_49;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    iVar4 = -1;
    if (quiet == '\0') {
      do_oprom_code_cold_3();
    }
    goto LAB_001079ab;
  }
  pcVar6 = *argv;
  iVar4 = argc + -1;
  argv_00 = argv + 1;
  _Var1 = arg_is_token(pcVar6,"version");
  if (_Var1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar4 = do_oprom_version(iVar4,argv_00,IGSC_OPROM_CODE);
      return iVar4;
    }
    goto LAB_00107ca9;
  }
  _Var1 = arg_is_token(pcVar6,"update");
  if (_Var1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar4 = do_oprom_update(iVar4,argv_00,IGSC_OPROM_CODE);
      return iVar4;
    }
    goto LAB_00107ca9;
  }
  _Var1 = arg_is_token(pcVar6,"supported-devices");
  if (_Var1) {
    if (iVar4 == 2) {
      pcVar6 = *argv_00;
      _Var1 = arg_is_image(pcVar6);
      if (!_Var1) goto LAB_001078d7;
      pcVar6 = argv[2];
      local_40 = 0;
      local_49 = '\0';
      local_4a = '\0';
      __ptr = image_read_from_file(pcVar6);
      if (__ptr == (img *)0x0) {
        iVar4 = 1;
        if (quiet != '\0') goto LAB_001079ab;
        pcVar5 = "Error: Failed to read :%s\n";
        goto LAB_001078fb;
      }
      iVar2 = igsc_image_oprom_init(&local_40,__ptr + 1,__ptr->size);
      if (iVar2 == 0) {
        iVar4 = igsc_image_oprom_type(local_40,&local_44);
        if (iVar4 == 0) {
          if ((local_44 & 2) == 0) {
            iVar4 = 1;
            if (quiet == '\0') {
              do_oprom_code_cold_2();
            }
          }
          else {
            uVar3 = igsc_image_oprom_has_4ids_extension(local_40,2,&local_49);
            if (uVar3 != 0) {
              iVar4 = 1;
              if (quiet != '\0') goto LAB_0010798e;
              pcVar6 = "Error: Failed to retrieve the 4ids status of the image: %d\n";
LAB_00107a66:
              iVar4 = 1;
              __ptr_00 = (void *)0x0;
              fprintf(_stderr,pcVar6,(ulong)uVar3);
              goto LAB_00107991;
            }
            uVar3 = igsc_image_oprom_has_2ids_extension(local_40,&local_4a);
            if (uVar3 == 0) {
              if (local_49 == '\x01') {
                if (local_4a == '\x01') {
                  iVar4 = 1;
                  if (quiet == '\0') {
                    pcVar5 = 
                    "Error: Illegal image %s, includes both 2ids and 4ids oprom extensions\n";
                    goto LAB_00107a88;
                  }
                }
                else {
                  uVar3 = igsc_image_oprom_count_devices_typed(local_40,2,&local_48);
                  if (uVar3 == 0) {
                    if ((verbose == '\x01') && (quiet == '\0')) {
                      fprintf(_stderr,"Found %d supported devices in image %s\n",(ulong)local_48,
                              pcVar6);
                    }
                    if ((ulong)local_48 == 0) {
                      if (quiet != '\0') goto LAB_00107af7;
                      iVar4 = 0;
                      fprintf(_stdout,"Image %s has empty supported devices list\n",pcVar6);
                    }
                    else {
                      __ptr_00 = calloc((ulong)local_48,8);
                      iVar4 = 1;
                      if (__ptr_00 != (void *)0x0) {
                        uVar3 = igsc_image_oprom_supported_devices_typed
                                          (local_40,2,__ptr_00,&local_48);
                        if (uVar3 != 0) {
                          if (quiet == '\0') {
                            fprintf(_stderr,
                                    "Error: Failed to get %d supported devices from image: %s, ret %d\n"
                                    ,(ulong)local_48,pcVar6,(ulong)uVar3);
                          }
                          goto LAB_00107991;
                        }
                        if (verbose == '\x01') {
                          if (quiet == '\0') {
                            fprintf(_stderr,"Retrieved %d supported devices in image %s\n",
                                    (ulong)local_48,pcVar6);
                            goto LAB_00107c3a;
                          }
                        }
                        else {
LAB_00107c3a:
                          if (quiet == '\0') {
                            fwrite("OPROM Code supported devices:\n",0x1e,1,_stdout);
                          }
                        }
                        if (local_48 == 0) {
                          iVar4 = 0;
                        }
                        else {
                          iVar4 = 0;
                          uVar7 = 0;
                          do {
                            printf("Vendor Id: %04X Device Id: %04X SubSystem Vendor Id: %04X SubSystem Device Id: %04X\n"
                                   ,(ulong)*(ushort *)((long)__ptr_00 + uVar7 * 8),
                                   (ulong)*(ushort *)((long)__ptr_00 + uVar7 * 8 + 2),
                                   (ulong)*(ushort *)((long)__ptr_00 + uVar7 * 8 + 4),
                                   (ulong)*(ushort *)((long)__ptr_00 + uVar7 * 8 + 6));
                            uVar7 = uVar7 + 1;
                          } while (uVar7 < local_48);
                        }
                        goto LAB_00107991;
                      }
                    }
                  }
                  else {
                    iVar4 = 1;
                    if (quiet == '\0') {
                      __ptr_00 = (void *)0x0;
                      fprintf(_stderr,
                              "Error: Failed to count supported devices on image: %s, returned %d\n"
                              ,pcVar6,(ulong)uVar3);
                      goto LAB_00107991;
                    }
                  }
                }
              }
              else {
                if (quiet == '\0') {
                  fwrite("OPROM Code image does not have the supported devices extension\n",0x3f,1,
                         _stdout);
                }
LAB_00107af7:
                iVar4 = 0;
              }
            }
            else {
              iVar4 = 1;
              if (quiet == '\0') {
                pcVar6 = "Error: Failed to retrieve the 2ids status of the image: %d\n";
                goto LAB_00107a66;
              }
            }
          }
        }
        else {
          iVar4 = 1;
          if (quiet == '\0') {
            pcVar5 = "Error: Failed to get oprom type from image: %s\n";
            goto LAB_00107a88;
          }
        }
LAB_0010798e:
        __ptr_00 = (void *)0x0;
      }
      else {
        iVar4 = 1;
        if (iVar2 == 5) {
          if (quiet != '\0') goto LAB_0010798e;
          pcVar5 = "Error: Invalid image format: %s\n";
        }
        else {
          if (quiet != '\0') goto LAB_0010798e;
          pcVar5 = "Error: Failed to parse image: %s\n";
        }
LAB_00107a88:
        iVar4 = 1;
        __ptr_00 = (void *)0x0;
        fprintf(_stderr,pcVar5,pcVar6);
      }
LAB_00107991:
      igsc_image_oprom_release(local_40);
      free(__ptr);
      free(__ptr_00);
    }
    else {
      iVar4 = -1;
      if (quiet == '\0') {
        do_oprom_code_cold_1();
      }
    }
  }
  else {
LAB_001078d7:
    iVar4 = -1;
    if (quiet == '\0') {
      pcVar5 = "Error: Wrong argument %s\n";
LAB_001078fb:
      fprintf(_stderr,pcVar5,pcVar6);
    }
  }
LAB_001079ab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
LAB_00107ca9:
  __stack_chk_fail();
}

Assistant:

static int do_oprom_code(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "version"))
    {
        return do_oprom_version(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "update"))
    {
        return do_oprom_update(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "supported-devices"))
    {
        return do_oprom_code_supported_devices(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}